

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::AggregateType::AggregateType
          (AggregateType *this,AggregateKind Kind,KUINT8 Domain,Country Country,KUINT8 Categoy,
          KUINT8 SubCategory,KUINT8 Specific,KUINT8 Extra)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__AggregateType_00223c88;
  this->m_ui8Kind = (KUINT8)Kind;
  this->m_ui8Domain = Domain;
  this->m_ui16Country = (KUINT16)Country;
  this->m_ui8Category = Categoy;
  this->m_ui8SubCategory = SubCategory;
  this->m_ui8Specific = Specific;
  this->m_ui8Extra = Extra;
  return;
}

Assistant:

AggregateType::AggregateType( AggregateKind Kind, KUINT8 Domain, Country Country, KUINT8  Categoy,
                              KUINT8 SubCategory, KUINT8 Specific, KUINT8 Extra ) :
    m_ui8Kind( Kind ),
    m_ui8Domain( Domain ),
    m_ui16Country( Country ),
    m_ui8Category( Categoy ),
    m_ui8SubCategory( SubCategory ),
    m_ui8Specific( Specific ),
    m_ui8Extra( Extra )
{
}